

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::_updateStackArgs(BaseRAPass *this)

{
  uint uVar1;
  long lVar2;
  RAWorkReg *pRVar3;
  RAStackSlot *this_00;
  bool bVar4;
  Error EVar5;
  int32_t iVar6;
  RAWorkReg **ppRVar7;
  ZoneVector<asmjit::v1_14::RAWorkReg_*> *pZVar8;
  size_t in_RDI;
  FuncValue *dstArg;
  FuncValue *srcArg;
  RAStackSlot *slot;
  RAWorkReg *workReg;
  uint32_t workId;
  uint32_t numWorkRegs;
  RAWorkRegs *workRegs;
  FuncFrame *frame;
  char *in_stack_000002e0;
  int in_stack_000002ec;
  char *in_stack_000002f0;
  ZoneVector<asmjit::v1_14::RAWorkReg_*> *in_stack_fffffffffffffef8;
  FuncDetail *in_stack_ffffffffffffff00;
  uint local_e8;
  
  lVar2 = *(long *)(in_RDI + 0x98);
  uVar1 = *(uint *)(in_RDI + 0x148);
  local_e8 = 0;
  do {
    if (uVar1 <= local_e8) {
      return 0;
    }
    ppRVar7 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](in_stack_fffffffffffffef8,in_RDI);
    pRVar3 = *ppRVar7;
    bVar4 = Support::test<asmjit::v1_14::RAWorkRegFlags,asmjit::v1_14::RAWorkRegFlags>
                      (*(RAWorkRegFlags *)(pRVar3 + 0x24),kStackArgToStack);
    if (bVar4) {
      if (pRVar3[0x48] == (RAWorkReg)0xff) {
        DebugUtils::assertionFailed(in_stack_000002f0,in_stack_000002ec,in_stack_000002e0);
      }
      this_00 = *(RAStackSlot **)(pRVar3 + 0x18);
      if (this_00 == (RAStackSlot *)0x0) {
        EVar5 = DebugUtils::errored(3);
        return EVar5;
      }
      bVar4 = RAStackSlot::isStackArg((RAStackSlot *)0x16010a);
      if (bVar4) {
        in_stack_ffffffffffffff00 =
             (FuncDetail *)
             FuncDetail::arg(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,in_RDI);
        bVar4 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                          (*(FuncAttributes *)(lVar2 + 0x2d0),kHasPreservedFP);
        if (bVar4) {
          RAStackSlot::setBaseRegId(this_00,*(uint32_t *)(in_RDI + 0x1ec));
          RAStackSlot::setOffset
                    (this_00,*(int *)(lVar2 + 0x2f8) +
                             ((int)*(uint32_t *)in_stack_ffffffffffffff00 >> 0xc));
        }
        else {
          RAStackSlot::setOffset
                    (this_00,*(int *)(lVar2 + 0x2f4) +
                             ((int)*(uint32_t *)in_stack_ffffffffffffff00 >> 0xc));
        }
      }
      else {
        pZVar8 = (ZoneVector<asmjit::v1_14::RAWorkReg_*> *)
                 FuncArgsAssignment::arg
                           ((FuncArgsAssignment *)in_stack_ffffffffffffff00,
                            (size_t)in_stack_fffffffffffffef8,in_RDI);
        in_stack_fffffffffffffef8 = pZVar8;
        iVar6 = RAStackSlot::offset(this_00);
        *(uint32_t *)pZVar8 = *(uint32_t *)pZVar8 & 0xfff | iVar6 << 0xc;
      }
    }
    local_e8 = local_e8 + 1;
  } while( true );
}

Assistant:

Error BaseRAPass::_updateStackArgs() noexcept {
  FuncFrame& frame = func()->frame();
  RAWorkRegs& workRegs = _workRegs;
  uint32_t numWorkRegs = workRegCount();

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = workRegs[workId];
    if (workReg->hasFlag(RAWorkRegFlags::kStackArgToStack)) {
      ASMJIT_ASSERT(workReg->hasArgIndex());
      RAStackSlot* slot = workReg->stackSlot();

      if (ASMJIT_UNLIKELY(!slot))
        return DebugUtils::errored(kErrorInvalidState);

      if (slot->isStackArg()) {
        const FuncValue& srcArg = _func->detail().arg(workReg->argIndex());
        if (frame.hasPreservedFP()) {
          slot->setBaseRegId(_fp.id());
          slot->setOffset(int32_t(frame.saOffsetFromSA()) + srcArg.stackOffset());
        }
        else {
          slot->setOffset(int32_t(frame.saOffsetFromSP()) + srcArg.stackOffset());
        }
      }
      else {
        FuncValue& dstArg = _argsAssignment.arg(workReg->argIndex(), workReg->argValueIndex());
        dstArg.setStackOffset(slot->offset());
      }
    }
  }

  return kErrorOk;
}